

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O0

string * duckdb::FormatOptionLine<std::__cxx11::string>
                   (string *name,
                   CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *option)

{
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__rhs
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff30;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  __rhs = in_RDI;
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  FormatValue(in_RDI);
  ::std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  ::std::operator+(in_stack_ffffffffffffff18,&__rhs->set_by_user);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  FormatSet(in_stack_ffffffffffffff38);
  ::std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  ::std::operator+(in_stack_ffffffffffffff18,&__rhs->set_by_user);
  ::std::__cxx11::string::~string(local_38);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string(local_78);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  ::std::__cxx11::string::~string(local_98);
  return (string *)__rhs;
}

Assistant:

string FormatOptionLine(const string &name, const CSVOption<T> &option) {
	return name + " = " + option.FormatValue() + " " + option.FormatSet() + "\n  ";
}